

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_binary_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op)

{
  bool bVar1;
  SPIRType *pSVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  char *op_local;
  string local_90;
  string local_70;
  string local_50;
  
  bVar3 = true;
  op_local = op;
  if ((this->backend).support_precise_qualifier == true) {
    bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)result_id,DecorationNoContraction);
    if (bVar1) {
      pSVar2 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
      bVar3 = *(int *)&(pSVar2->super_IVariant).field_0xc - 0xfU < 0xfffffffd;
    }
  }
  bVar1 = should_forward(this,op0);
  if (bVar1) {
    bVar1 = should_forward(this,op1);
    bVar1 = (bool)(bVar1 & bVar3);
  }
  else {
    bVar1 = false;
  }
  to_enclosed_unpacked_expression_abi_cxx11_(&local_70,this,op0,true);
  to_enclosed_unpacked_expression_abi_cxx11_(&local_90,this,op1,true);
  join<std::__cxx11::string,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string>
            (&local_50,(spirv_cross *)&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39ece0,
             (char (*) [2])&op_local,(char **)0x39ece0,(char (*) [2])&local_90,
             in_stack_ffffffffffffff58);
  emit_op(this,result_type,result_id,&local_50,bVar1,false);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  return;
}

Assistant:

void CompilerGLSL::emit_binary_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1, const char *op)
{
	// Various FP arithmetic opcodes such as add, sub, mul will hit this.
	bool force_temporary_precise = backend.support_precise_qualifier &&
	                               has_decoration(result_id, DecorationNoContraction) &&
	                               type_is_floating_point(get<SPIRType>(result_type));
	bool forward = should_forward(op0) && should_forward(op1) && !force_temporary_precise;

	emit_op(result_type, result_id,
	        join(to_enclosed_unpacked_expression(op0), " ", op, " ", to_enclosed_unpacked_expression(op1)), forward);

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}